

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QGraphicsSceneBspTree::Node>::resize_internal
          (QList<QGraphicsSceneBspTree::Node> *this,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QGraphicsSceneBspTree::Node> *this_00;
  __off_t __length;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_RSI;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_RDI;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffffd0;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *this_01;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *in_stack_ffffffffffffffe0;
  QArrayDataPointer<QGraphicsSceneBspTree::Node> *__file;
  
  QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QGraphicsSceneBspTree::Node>::needsDetach(in_stack_ffffffffffffffd0);
  this_01 = in_RSI;
  if (!bVar1) {
    in_stack_ffffffffffffffd8 =
         (QArrayDataPointer<QGraphicsSceneBspTree::Node> *)
         capacity((QList<QGraphicsSceneBspTree::Node> *)0xa1abf1);
    qVar2 = QArrayDataPointer<QGraphicsSceneBspTree::Node>::freeSpaceAtBegin
                      (in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 = in_RSI;
    if ((long)in_RSI <= (long)in_stack_ffffffffffffffd8 - qVar2) {
      __file = this_01;
      qVar2 = size((QList<QGraphicsSceneBspTree::Node> *)in_RDI);
      if (qVar2 <= (long)this_01) {
        return;
      }
      this_00 = (QPodArrayOps<QGraphicsSceneBspTree::Node> *)
                QArrayDataPointer<QGraphicsSceneBspTree::Node>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QGraphicsSceneBspTree::Node>::truncate
                (this_00,(char *)__file,__length);
      return;
    }
  }
  QArrayDataPointer<QGraphicsSceneBspTree::Node>::detachAndGrow
            (this_01,(GrowthPosition)((ulong)in_RDI >> 0x20),(qsizetype)in_stack_ffffffffffffffe0,
             (Node **)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

inline void QList<T>::resize_internal(qsizetype newSize)
{
    Q_ASSERT(newSize >= 0);

    if (d->needsDetach() || newSize > capacity() - d.freeSpaceAtBegin()) {
        d.detachAndGrow(QArrayData::GrowsAtEnd, newSize - d.size, nullptr, nullptr);
    } else if (newSize < size()) {
        d->truncate(newSize);
    }
}